

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sst_comm.cpp
# Opt level: O1

int SMPI_Allreduce(void *sendbuf,void *recvbuf,int count,SMPI_Datatype datatype,SMPI_Op op,
                  SMPI_Comm comm)

{
  long *plVar1;
  Datatype DVar2;
  undefined1 *local_48;
  undefined8 local_40;
  undefined1 local_38 [16];
  
  switch(datatype) {
  case SMPI_INT:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<int>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,1,&local_48);
    }
    break;
  case SMPI_LONG:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<long>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,1,&local_48);
    }
    break;
  case SMPI_SIZE_T:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_long>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,1,&local_48);
    }
    break;
  case SMPI_CHAR:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<char>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,1,&local_48);
    }
    break;
  case SMPI_BYTE:
    if (op == SMPI_LAND) {
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,5,&local_48);
    }
    else {
      if (op != SMPI_MAX) {
        return 0;
      }
      local_48 = local_38;
      local_40 = 0;
      local_38[0] = 0;
      plVar1 = *(long **)comm;
      DVar2 = adios2::helper::CommImpl::GetDatatype<unsigned_char>();
      (**(code **)(*plVar1 + 0x68))(plVar1,sendbuf,recvbuf,(long)count,DVar2,1,&local_48);
    }
    break;
  default:
    goto switchD_0011c989_default;
  }
  if (local_48 != local_38) {
    operator_delete(local_48);
  }
switchD_0011c989_default:
  return 0;
}

Assistant:

int SMPI_Allreduce(const void *sendbuf, void *recvbuf, int count, SMPI_Datatype datatype,
                   SMPI_Op op, SMPI_Comm comm)
{
    switch (datatype)
    {
#define F(type)                                                                                    \
    SMPI_Allreduce_Impl(static_cast<const type *>(sendbuf), static_cast<type *>(recvbuf), count,   \
                        op, comm)
        CASE_FOR_EACH_TYPE(F);
#undef F
    }
    return 0;
}